

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_reaction_diffusion_mri.c
# Opt level: O2

int fs(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  long lVar2;
  int iVar3;
  double *returnvalue;
  double *returnvalue_00;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  lVar2 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x10);
  dVar7 = *(double *)((long)user_data + 8);
  returnvalue = (double *)N_VGetArrayPointer();
  iVar3 = check_retval(returnvalue,"N_VGetArrayPointer",0);
  iVar5 = 1;
  if (iVar3 == 0) {
    returnvalue_00 = (double *)N_VGetArrayPointer(ydot);
    iVar3 = check_retval(returnvalue_00,"N_VGetArrayPointer",0);
    if (iVar3 == 0) {
      dVar6 = (dVar1 / dVar7) / dVar7;
      dVar7 = ((dVar1 + dVar1) / dVar7) / dVar7;
      *returnvalue_00 = (returnvalue[1] - *returnvalue) * dVar7;
      for (lVar4 = 1; lVar4 < lVar2 + -1; lVar4 = lVar4 + 1) {
        returnvalue_00[lVar4] =
             returnvalue[lVar4 + 1] * dVar6 +
             returnvalue[lVar4 + -1] * dVar6 + returnvalue[lVar4] * -dVar7;
      }
      returnvalue_00[lVar2 + -1] = dVar7 * (returnvalue[lVar2 + -2] - returnvalue[lVar2 + -1]);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int fs(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata = (UserData)user_data; /* access problem data */
  sunindextype N = udata->N;            /* set variable shortcuts */
  sunrealtype k  = udata->k;
  sunrealtype dx = udata->dx;
  sunrealtype *Y = NULL, *Ydot = NULL;
  sunrealtype c1, c2;
  sunindextype i;

  /* access state array data */
  Y = N_VGetArrayPointer(y);
  if (check_retval((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }

  /* access RHS array data */
  Ydot = N_VGetArrayPointer(ydot);
  if (check_retval((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over domain, computing diffusion term */
  c1 = k / dx / dx;
  c2 = SUN_RCONST(2.0) * k / dx / dx;

  /* left boundary condition */
  Ydot[0] = c2 * (Y[1] - Y[0]);

  /* interior points */
  for (i = 1; i < N - 1; i++)
  {
    Ydot[i] = c1 * Y[i - 1] - c2 * Y[i] + c1 * Y[i + 1];
  }

  /* right boundary condition */
  Ydot[N - 1] = c2 * (Y[N - 2] - Y[N - 1]);

  /* Return with success */
  return 0;
}